

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O0

Type * __thiscall
spvtools::opt::analysis::TypeManager::GetMemberType
          (TypeManager *this,Type *parent_type,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *access_chain)

{
  uint uVar1;
  bool bVar2;
  reference puVar3;
  Struct *this_00;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  *this_01;
  const_reference ppTVar4;
  Array *this_02;
  RuntimeArray *this_03;
  Vector *this_04;
  Matrix *this_05;
  Matrix *matrix_type;
  Vector *vector_type;
  RuntimeArray *runtime_array_type;
  Array *array_type;
  Struct *struct_type;
  const_iterator cStack_38;
  uint32_t element_index;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *access_chain_local;
  Type *parent_type_local;
  TypeManager *this_local;
  
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(access_chain);
  cStack_38 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(access_chain);
  access_chain_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)parent_type;
  do {
    bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffc8);
    if (!bVar2) {
      return (Type *)access_chain_local;
    }
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    uVar1 = *puVar3;
    this_00 = (Struct *)
              (**(code **)((access_chain_local->
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                           super__Vector_impl_data._M_start + 0x3c))();
    if (this_00 == (Struct *)0x0) {
      this_02 = (Array *)(**(code **)((access_chain_local->
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 0x30))();
      if (this_02 == (Array *)0x0) {
        this_03 = (RuntimeArray *)
                  (**(code **)((access_chain_local->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start + 0x34))();
        if (this_03 == (RuntimeArray *)0x0) {
          this_04 = (Vector *)
                    (**(code **)((access_chain_local->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_start + 0x1c))();
          if (this_04 == (Vector *)0x0) {
            this_05 = (Matrix *)
                      (**(code **)((access_chain_local->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_start + 0x20))();
            if (this_05 == (Matrix *)0x0) {
              __assert_fail("false && \"Trying to get a member of a type without members.\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
                            ,0x43e,
                            "const Type *spvtools::opt::analysis::TypeManager::GetMemberType(const Type *, const std::vector<uint32_t> &)"
                           );
            }
            access_chain_local =
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 Matrix::element_type(this_05);
          }
          else {
            access_chain_local =
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 Vector::element_type(this_04);
          }
        }
        else {
          access_chain_local =
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               RuntimeArray::element_type(this_03);
        }
      }
      else {
        access_chain_local =
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)Array::element_type(this_02);
      }
    }
    else {
      this_01 = Struct::element_types(this_00);
      ppTVar4 = std::
                vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                ::operator[](this_01,(ulong)uVar1);
      access_chain_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)*ppTVar4;
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

const Type* TypeManager::GetMemberType(
    const Type* parent_type, const std::vector<uint32_t>& access_chain) {
  for (uint32_t element_index : access_chain) {
    if (const Struct* struct_type = parent_type->AsStruct()) {
      parent_type = struct_type->element_types()[element_index];
    } else if (const Array* array_type = parent_type->AsArray()) {
      parent_type = array_type->element_type();
    } else if (const RuntimeArray* runtime_array_type =
                   parent_type->AsRuntimeArray()) {
      parent_type = runtime_array_type->element_type();
    } else if (const Vector* vector_type = parent_type->AsVector()) {
      parent_type = vector_type->element_type();
    } else if (const Matrix* matrix_type = parent_type->AsMatrix()) {
      parent_type = matrix_type->element_type();
    } else {
      assert(false && "Trying to get a member of a type without members.");
    }
  }
  return parent_type;
}